

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t readback_bytes(mime_state *state,char *buffer,size_t bufsize,char *bytes,size_t numbytes,
                     char *trail)

{
  size_t sVar1;
  ulong uVar2;
  size_t tsz;
  size_t sz;
  char *trail_local;
  size_t numbytes_local;
  char *bytes_local;
  size_t bufsize_local;
  char *buffer_local;
  mime_state *state_local;
  
  if (state->offset < numbytes) {
    tsz = numbytes - state->offset;
    numbytes_local = (size_t)(bytes + state->offset);
  }
  else {
    sVar1 = strlen(trail);
    uVar2 = state->offset - numbytes;
    if (sVar1 <= uVar2) {
      return 0;
    }
    numbytes_local = (size_t)(trail + uVar2);
    tsz = sVar1 - uVar2;
  }
  if (bufsize < tsz) {
    tsz = bufsize;
  }
  memcpy(buffer,(void *)numbytes_local,tsz);
  state->offset = tsz + state->offset;
  return tsz;
}

Assistant:

static size_t readback_bytes(mime_state *state,
                             char *buffer, size_t bufsize,
                             const char *bytes, size_t numbytes,
                             const char *trail)
{
  size_t sz;

  if(numbytes > state->offset) {
    sz = numbytes - state->offset;
    bytes += state->offset;
  }
  else {
    size_t tsz = strlen(trail);

    sz = state->offset - numbytes;
    if(sz >= tsz)
      return 0;
    bytes = trail + sz;
    sz = tsz - sz;
  }

  if(sz > bufsize)
    sz = bufsize;

  memcpy(buffer, bytes, sz);
  state->offset += sz;
  return sz;
}